

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O0

void Cnf_DeriveMapping(Cnf_Man_t *p)

{
  int iVar1;
  int *pAreaFlows_00;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  int *pAreaFlows;
  int local_38;
  int AreaFlow;
  int k;
  int i;
  Dar_Cut_t *pCutBest;
  Dar_Cut_t *pCut;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSuper;
  Cnf_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  pAreaFlows_00 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  memset(pAreaFlows_00,0,(long)iVar1 << 2);
  p_00 = Vec_PtrAlloc(100);
  for (AreaFlow = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), AreaFlow < iVar1;
      AreaFlow = AreaFlow + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,AreaFlow);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) {
      _k = (Dar_Cut_t *)0x0;
      pCutBest = Dar_ObjCuts(pObj_00);
      for (local_38 = 0;
          local_38 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x38);
          local_38 = local_38 + 1) {
        if ((((*(uint *)&pCutBest->field_0x4 >> 0x1c & 1) != 0) &&
            (*(uint *)&pCutBest->field_0x4 = *(uint *)&pCutBest->field_0x4 & 0xf7ffffff,
            local_38 != 0)) &&
           (((Cnf_CutAssignAreaFlow(p,pCutBest,pAreaFlows_00), _k == (Dar_Cut_t *)0x0 ||
             (pCutBest->uSign < _k->uSign)) ||
            ((_k->uSign == pCutBest->uSign &&
             ((*(uint *)&_k->field_0x4 >> 0x10 & 0x7ff) <
              (*(uint *)&pCutBest->field_0x4 >> 0x10 & 0x7ff))))))) {
          _k = pCutBest;
        }
        pCutBest = pCutBest + 1;
      }
      if ((int)_k->uSign < 0x3b9aca01) {
        pAreaFlows_00[pObj_00->Id] = _k->uSign;
        *(uint *)&_k->field_0x4 = *(uint *)&_k->field_0x4 & 0xf7ffffff | 0x8000000;
      }
      else {
        pAreaFlows_00[pObj_00->Id] = 1000000000;
        *(ulong *)&pObj_00->field_0x18 = *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffdf | 0x20;
      }
    }
  }
  Vec_PtrFree(p_00);
  if (pAreaFlows_00 != (int *)0x0) {
    free(pAreaFlows_00);
  }
  return;
}

Assistant:

void Cnf_DeriveMapping( Cnf_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut, * pCutBest;
    int i, k, AreaFlow, * pAreaFlows;
    // allocate area flows
    pAreaFlows = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    memset( pAreaFlows, 0, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    // visit the nodes in the topological order and update their best cuts
    vSuper = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        // go through the cuts
        pCutBest = NULL;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            pCut->fBest = 0;
            if ( k == 0 )
                continue;
            Cnf_CutAssignAreaFlow( p, pCut, pAreaFlows );
            if ( pCutBest == NULL || pCutBest->uSign > pCut->uSign || 
                (pCutBest->uSign == pCut->uSign && pCutBest->Value < pCut->Value) )
                 pCutBest = pCut;
        }
        // check the big cut
//        Aig_ObjCollectSuper( pObj, vSuper );
        // get the area flow of this cut
//        AreaFlow = Cnf_CutSuperAreaFlow( vSuper, pAreaFlows );
        AreaFlow = ABC_INFINITY;
        if ( AreaFlow >= (int)pCutBest->uSign )
        {
            pAreaFlows[pObj->Id] = pCutBest->uSign;
            pCutBest->fBest = 1;
        }
        else
        {
            pAreaFlows[pObj->Id] = AreaFlow;
            pObj->fMarkB = 1; // mark the special node
        }
    }
    Vec_PtrFree( vSuper );
    ABC_FREE( pAreaFlows );

/*
    // compute the area of mapping
    AreaFlow = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        AreaFlow += Dar_ObjBestCut(Aig_ObjFanin0(pObj))->uSign / 100 / Aig_ObjFanin0(pObj)->nRefs;
    printf( "Area of the network = %d.\n", AreaFlow );
*/
}